

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O2

Expression *
slang::ast::bindTerminal
          (ExpressionSyntax *syntax,SpecifyTerminalDir dir,Scope *parentParent,ASTContext *context)

{
  bool bVar1;
  int iVar2;
  ExpressionKind EVar3;
  DiagCode DVar4;
  SourceLocation in_RAX;
  undefined4 extraout_var;
  SourceLocation unaff_RBX;
  DiagCode code;
  Expression *pEVar5;
  SourceRange SVar6;
  Expression *this;
  
  iVar2 = Expression::bind((int)syntax,(sockaddr *)context,0);
  this = (Expression *)CONCAT44(extraout_var,iVar2);
  bVar1 = Expression::bad(this);
  if (bVar1) {
    return (Expression *)0x0;
  }
  EVar3 = this->kind;
  pEVar5 = this;
  if ((EVar3 & ~IntegerLiteral) == ElementSelect) {
    pEVar5 = *(Expression **)(this + 1);
    EVar3 = pEVar5->kind;
  }
  if (EVar3 == NamedValue) {
LAB_00697a98:
    SVar6.endLoc = unaff_RBX;
    SVar6.startLoc = in_RAX;
    bVar1 = SpecifyBlockSymbol::checkPathTerminal
                      (*(SpecifyBlockSymbol **)(pEVar5 + 1),(ValueSymbol *)(this->type).ptr,
                       (Type *)parentParent,(Scope *)(ulong)dir,
                       SUB84((pEVar5->sourceRange).startLoc,0),SVar6);
    if (bVar1) {
      return this;
    }
  }
  else {
    if (EVar3 == HierarchicalValue) {
      bVar1 = HierarchicalReference::isViaIfacePort((HierarchicalReference *)&pEVar5[1].type);
      if (bVar1) goto LAB_00697a98;
      EVar3 = pEVar5->kind;
    }
    DVar4.subsystem = Declarations;
    DVar4.code = 0xc0;
    code.subsystem = Declarations;
    code.code = 100;
    if ((EVar3 & ~IntegerLiteral) == ElementSelect) {
      code = DVar4;
    }
    SVar6 = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
    ASTContext::addDiag(context,code,SVar6);
  }
  return (Expression *)0x0;
}

Assistant:

static const Expression* bindTerminal(const ExpressionSyntax& syntax,
                                      SpecifyBlockSymbol::SpecifyTerminalDir dir,
                                      const Scope* parentParent, ASTContext& context) {
    auto expr = &Expression::bind(syntax, context);
    if (expr->bad())
        return nullptr;

    const Expression* valueExpr;
    switch (expr->kind) {
        case ExpressionKind::ElementSelect:
            valueExpr = &expr->as<ElementSelectExpression>().value();
            break;
        case ExpressionKind::RangeSelect:
            valueExpr = &expr->as<RangeSelectExpression>().value();
            break;
        default:
            valueExpr = expr;
            break;
    }

    if (valueExpr->kind != ExpressionKind::NamedValue &&
        (valueExpr->kind != ExpressionKind::HierarchicalValue ||
         !valueExpr->as<HierarchicalValueExpression>().ref.isViaIfacePort())) {
        auto code = (valueExpr->kind == ExpressionKind::ElementSelect ||
                     valueExpr->kind == ExpressionKind::RangeSelect)
                        ? diag::SpecifyPathMultiDim
                        : diag::InvalidSpecifyPath;
        context.addDiag(code, syntax.sourceRange());
    }
    else {
        auto& symbol = valueExpr->as<ValueExpressionBase>().symbol;
        if (SpecifyBlockSymbol::checkPathTerminal(symbol, *expr->type, *parentParent, dir,
                                                  valueExpr->sourceRange)) {
            return expr;
        }
    }

    return nullptr;
}